

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::SetDirectedEnergyRecords
          (Directed_Energy_Fire_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *DE)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  pointer pKVar4;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::operator=(&this->m_vDeRec,DE);
  pKVar4 = (DE->
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (DE->
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui16NumDERecs = (KUINT16)(((long)pKVar2 - (long)pKVar4) / 0x18);
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  for (; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    KVar3 = DATA_TYPE::StandardVariable::GetRecordLength(pKVar4->m_pRef);
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar3;
  }
  return;
}

Assistant:

void Directed_Energy_Fire_PDU::SetDirectedEnergyRecords( const vector<StdVarPtr> & DE )
{
    m_vDeRec = DE;
    m_ui16NumDERecs = DE.size();
    m_ui16PDULength = DIRECTED_ENERGY_PDU_SIZE;

    // Calculate new pdu length
    vector<StdVarPtr>::const_iterator citr = DE.begin();
    vector<StdVarPtr>::const_iterator citrEnd = DE.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetRecordLength();
    }
}